

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_interface.c
# Opt level: O3

int fe_mfcc_to_float(fe_t *fe,mfcc_t **input,float32 **output,int32 nframes)

{
  mfcc_t *pmVar1;
  float32 *pfVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar3 = (uint)fe->feature_dimension * nframes;
  if (input != output) {
    if ((int)uVar3 < 1) {
      return 0;
    }
    pmVar1 = *input;
    pfVar2 = *output;
    uVar4 = 0;
    do {
      pfVar2[uVar4] = pmVar1[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  return uVar3;
}

Assistant:

int32
fe_mfcc_to_float(fe_t * fe,
                 mfcc_t ** input, float32 ** output, int32 nframes)
{
    int32 i;

#ifndef FIXED_POINT
    if ((void *) input == (void *) output)
        return nframes * fe->feature_dimension;
#endif
    for (i = 0; i < nframes * fe->feature_dimension; ++i)
        output[0][i] = MFCC2FLOAT(input[0][i]);

    return i;
}